

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O0

TextureFormat
deqp::gls::ShaderExecUtil::getRenderbufferFormatForOutput(VarType *outputType,bool useIntOutputs)

{
  DataType DVar1;
  InternalError *this;
  allocator<char> local_69;
  string local_68;
  ChannelType local_44;
  int local_40;
  ChannelType channelType;
  int numComps;
  DataType basicType;
  ChannelOrder channelOrderMap [4];
  bool useIntOutputs_local;
  VarType *outputType_local;
  
  _numComps = 0x500000000;
  channelOrderMap[0] = RGBA;
  channelOrderMap[1] = RGBA;
  channelType = glu::VarType::getBasicType(outputType);
  local_40 = glu::getDataTypeNumComponents(channelType);
  DVar1 = glu::getDataTypeScalarType(channelType);
  switch(DVar1) {
  case TYPE_FLOAT:
    local_44 = FLOAT;
    if (useIntOutputs) {
      local_44 = UNSIGNED_INT32;
    }
    break;
  default:
    this = (InternalError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"Invalid output type",&local_69);
    tcu::InternalError::InternalError(this,&local_68);
    __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
  case TYPE_INT:
    local_44 = SIGNED_INT32;
    break;
  case TYPE_UINT:
    local_44 = UNSIGNED_INT32;
    break;
  case TYPE_BOOL:
    local_44 = SIGNED_INT32;
  }
  tcu::TextureFormat::TextureFormat
            ((TextureFormat *)&outputType_local,(&numComps)[local_40 + -1],local_44);
  return (TextureFormat)outputType_local;
}

Assistant:

static tcu::TextureFormat getRenderbufferFormatForOutput (const glu::VarType& outputType, bool useIntOutputs)
{
	const tcu::TextureFormat::ChannelOrder channelOrderMap[] =
	{
		tcu::TextureFormat::R,
		tcu::TextureFormat::RG,
		tcu::TextureFormat::RGBA,	// No RGB variants available.
		tcu::TextureFormat::RGBA
	};

	const glu::DataType					basicType		= outputType.getBasicType();
	const int							numComps		= glu::getDataTypeNumComponents(basicType);
	tcu::TextureFormat::ChannelType		channelType;

	switch (glu::getDataTypeScalarType(basicType))
	{
		case glu::TYPE_UINT:	channelType = tcu::TextureFormat::UNSIGNED_INT32;												break;
		case glu::TYPE_INT:		channelType = tcu::TextureFormat::SIGNED_INT32;													break;
		case glu::TYPE_BOOL:	channelType = tcu::TextureFormat::SIGNED_INT32;													break;
		case glu::TYPE_FLOAT:	channelType = useIntOutputs ? tcu::TextureFormat::UNSIGNED_INT32 : tcu::TextureFormat::FLOAT;	break;
		default:
			throw tcu::InternalError("Invalid output type");
	}

	DE_ASSERT(de::inRange<int>(numComps, 1, DE_LENGTH_OF_ARRAY(channelOrderMap)));

	return tcu::TextureFormat(channelOrderMap[numComps-1], channelType);
}